

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint _w;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  void *pvVar16;
  undefined4 *puVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  ulong local_190;
  void *local_188;
  void *local_180;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar9 = inch + 3;
  if (-1 < inch) {
    iVar9 = inch;
  }
  iVar7 = outch + 3;
  if (-1 < outch) {
    iVar7 = outch;
  }
  Mat::create(kernel_tm,_w * 0x10,iVar9 >> 2,iVar7 >> 2,4,(Allocator *)0x0);
  if (3 < outch) {
    lVar6 = (long)local_78.w;
    lVar15 = local_78.elemsize * local_78.cstep;
    lVar2 = local_78.cstep * 3;
    lVar1 = lVar6 * 3;
    lVar8 = local_78.elemsize * lVar6;
    sVar3 = kernel_tm->cstep;
    sVar4 = kernel_tm->elemsize;
    pvVar5 = kernel_tm->data;
    local_120 = (void *)((lVar2 + lVar1) * local_78.elemsize + (long)local_78.data);
    local_128 = (void *)((lVar1 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data);
    local_118 = (void *)((lVar1 + local_78.cstep) * local_78.elemsize + (long)local_78.data);
    local_158 = (void *)(lVar8 * 3 + (long)local_78.data);
    local_130 = (void *)((lVar2 + lVar6 * 2) * local_78.elemsize + (long)local_78.data);
    local_138 = (void *)((lVar6 * 2 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data)
    ;
    local_140 = (void *)((local_78.cstep + lVar6 * 2) * local_78.elemsize + (long)local_78.data);
    local_110 = (void *)((lVar2 + lVar6) * local_78.elemsize + (long)local_78.data);
    local_148 = (void *)((lVar6 + local_78.cstep * 2) * local_78.elemsize + (long)local_78.data);
    local_100 = (void *)((local_78.cstep + lVar6) * local_78.elemsize + (long)local_78.data);
    lVar1 = lVar8 * 4;
    local_160 = (void *)((long)local_78.data + lVar8 * 2);
    local_150 = (void *)(lVar8 + (long)local_78.data);
    local_168 = (void *)(lVar15 * 3 + (long)local_78.data);
    lVar2 = lVar15 * 4;
    local_170 = (void *)((long)local_78.data + lVar15 * 2);
    local_f8 = local_78.data;
    local_108 = (void *)(lVar15 + (long)local_78.data);
    local_190 = 0;
    do {
      if (3 < inch) {
        puVar17 = (undefined4 *)((local_190 >> 2) * sVar3 * sVar4 + (long)pvVar5);
        local_d0 = local_f8;
        local_d8 = local_108;
        local_e0 = local_170;
        local_e8 = local_168;
        local_180 = local_128;
        local_188 = local_120;
        pvVar21 = local_100;
        lVar6 = 0;
        pvVar20 = local_158;
        pvVar13 = local_140;
        pvVar14 = local_110;
        pvVar16 = local_130;
        pvVar11 = local_150;
        pvVar12 = local_138;
        pvVar19 = local_148;
        pvVar18 = local_118;
        pvVar22 = local_160;
        do {
          if (0 < (int)_w) {
            lVar8 = 0;
            do {
              *puVar17 = *(undefined4 *)((long)local_d0 + lVar8);
              puVar17[1] = *(undefined4 *)((long)local_d8 + lVar8);
              puVar17[2] = *(undefined4 *)((long)local_e0 + lVar8);
              puVar17[3] = *(undefined4 *)((long)local_e8 + lVar8);
              puVar17[4] = *(undefined4 *)((long)pvVar11 + lVar8);
              puVar17[5] = *(undefined4 *)((long)pvVar21 + lVar8);
              puVar17[6] = *(undefined4 *)((long)pvVar19 + lVar8);
              puVar17[7] = *(undefined4 *)((long)pvVar14 + lVar8);
              puVar17[8] = *(undefined4 *)((long)pvVar22 + lVar8);
              puVar17[9] = *(undefined4 *)((long)pvVar13 + lVar8);
              puVar17[10] = *(undefined4 *)((long)pvVar12 + lVar8);
              puVar17[0xb] = *(undefined4 *)((long)pvVar16 + lVar8);
              puVar17[0xc] = *(undefined4 *)((long)pvVar20 + lVar8);
              puVar17[0xd] = *(undefined4 *)((long)pvVar18 + lVar8);
              puVar17[0xe] = *(undefined4 *)((long)local_180 + lVar8);
              puVar17[0xf] = *(undefined4 *)((long)local_188 + lVar8);
              puVar17 = puVar17 + 0x10;
              lVar8 = lVar8 + 4;
            } while ((ulong)_w << 2 != lVar8);
          }
          lVar8 = lVar6 + 7;
          local_188 = (void *)((long)local_188 + lVar1);
          local_180 = (void *)((long)local_180 + lVar1);
          pvVar18 = (void *)((long)pvVar18 + lVar1);
          pvVar20 = (void *)((long)pvVar20 + lVar1);
          pvVar16 = (void *)((long)pvVar16 + lVar1);
          pvVar12 = (void *)((long)pvVar12 + lVar1);
          pvVar13 = (void *)((long)pvVar13 + lVar1);
          pvVar22 = (void *)((long)pvVar22 + lVar1);
          pvVar14 = (void *)((long)pvVar14 + lVar1);
          pvVar19 = (void *)((long)pvVar19 + lVar1);
          pvVar21 = (void *)((long)pvVar21 + lVar1);
          pvVar11 = (void *)((long)pvVar11 + lVar1);
          local_e8 = (void *)((long)local_e8 + lVar1);
          local_e0 = (void *)((long)local_e0 + lVar1);
          local_d8 = (void *)((long)local_d8 + lVar1);
          local_d0 = (void *)((long)local_d0 + lVar1);
          lVar6 = lVar6 + 4;
        } while (lVar8 < inch);
      }
      uVar10 = local_190 + 7;
      local_120 = (void *)((long)local_120 + lVar2);
      local_128 = (void *)((long)local_128 + lVar2);
      local_118 = (void *)((long)local_118 + lVar2);
      local_158 = (void *)((long)local_158 + lVar2);
      local_130 = (void *)((long)local_130 + lVar2);
      local_138 = (void *)((long)local_138 + lVar2);
      local_140 = (void *)((long)local_140 + lVar2);
      local_160 = (void *)((long)local_160 + lVar2);
      local_110 = (void *)((long)local_110 + lVar2);
      local_148 = (void *)((long)local_148 + lVar2);
      local_100 = (void *)((long)local_100 + lVar2);
      local_150 = (void *)((long)local_150 + lVar2);
      local_168 = (void *)((long)local_168 + lVar2);
      local_170 = (void *)((long)local_170 + lVar2);
      local_108 = (void *)((long)local_108 + lVar2);
      local_f8 = (void *)((long)local_f8 + lVar2);
      local_190 = local_190 + 4;
    } while (uVar10 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * maxk, inch / 4, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00[4] = k01[k];
                g00[5] = k11[k];
                g00[6] = k21[k];
                g00[7] = k31[k];

                g00[8] = k02[k];
                g00[9] = k12[k];
                g00[10] = k22[k];
                g00[11] = k32[k];

                g00[12] = k03[k];
                g00[13] = k13[k];
                g00[14] = k23[k];
                g00[15] = k33[k];

                g00 += 16;
            }
        }
    }
}